

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObject.cpp
# Opt level: O0

void __thiscall PDFObject::SetMetadata(PDFObject *this,string *inKey,IDeletable *inValue)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*>
  local_48;
  IDeletable *local_20;
  IDeletable *inValue_local;
  string *inKey_local;
  PDFObject *this_local;
  
  local_20 = inValue;
  inValue_local = (IDeletable *)inKey;
  inKey_local = (string *)this;
  DeleteMetadata(this,inKey);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*>
  ::pair<IDeletable_*&,_true>
            (&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inValue_local,
             &local_20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*>_>_>
  ::insert(&this->mMetadata,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*>
  ::~pair(&local_48);
  return;
}

Assistant:

void PDFObject::SetMetadata(const std::string& inKey, IDeletable* inValue) {
	// delete old metadata
	DeleteMetadata(inKey);

	mMetadata.insert(StringToIDeletable::value_type(inKey, inValue));
}